

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httppost.cpp
# Opt level: O2

void __thiscall
hbm::HttpPost::HttpPost(HttpPost *this,string *address,string *port,string *httpPath)

{
  runtime_error *this_00;
  
  std::__cxx11::string::string((string *)this,(string *)address);
  std::__cxx11::string::string((string *)&this->m_port,(string *)port);
  std::__cxx11::string::string((string *)&this->m_httpPath,(string *)httpPath);
  if ((this->m_address)._M_string_length == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no stream server address provided");
  }
  else if ((this->m_port)._M_string_length == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no stream server control port provided");
  }
  else {
    if ((this->m_httpPath)._M_string_length != 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no stream server path id provided");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

HttpPost::HttpPost(const std::string &address, const std::string &port, const std::string &httpPath)
		: m_address(address)
		, m_port(port)
		, m_httpPath(httpPath)
	{
		if(m_address.empty()) {
			throw std::runtime_error("no stream server address provided");
		}
		if(m_port.empty()) {
			throw std::runtime_error("no stream server control port provided");
		}
		if(m_httpPath.empty()) {
			throw std::runtime_error("no stream server path id provided");
		}

	}